

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerBoundCheck(Lowerer *this,Instr *instr)

{
  OpCode OVar1;
  Func *func;
  code *pcVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  int32 iVar6;
  BailOutKind bailOutKindToLower;
  undefined4 *puVar7;
  IntConstOpnd *pIVar8;
  LabelInstr *target;
  Opnd *pOVar9;
  Lowerer *pLVar10;
  Lowerer *this_00;
  Lowerer *opnd;
  bool isRightOpnd;
  bool isRightOpnd_00;
  undefined1 left [8];
  undefined1 local_70 [8];
  AutoReuseOpnd autoReuseAddResultOpnd;
  IntConstOpnd *local_50;
  LabelInstr *local_40;
  OpCode local_32;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3577,"(instr)","instr");
    if (!bVar5) goto LAB_0055fe23;
    *puVar7 = 0;
  }
  OVar1 = instr->m_opcode;
  if (1 < (ushort)(OVar1 - BoundCheck)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3578,
                       "(instr->m_opcode == Js::OpCode::BoundCheck || instr->m_opcode == Js::OpCode::UnsignedBoundCheck)"
                       ,
                       "instr->m_opcode == Js::OpCode::BoundCheck || instr->m_opcode == Js::OpCode::UnsignedBoundCheck"
                      );
    if (!bVar5) goto LAB_0055fe23;
    *puVar7 = 0;
    OVar1 = instr->m_opcode;
  }
  if (OVar1 == UnsignedBoundCheck) {
    bVar5 = IR::Opnd::IsRegOpnd(instr->m_src1);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x357f,"(instr->GetSrc1()->IsRegOpnd())","instr->GetSrc1()->IsRegOpnd()");
      if (!bVar5) goto LAB_0055fe23;
      *puVar7 = 0;
    }
    if (instr->m_src1->m_type != TyInt32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3580,"(instr->GetSrc1()->IsInt32())","instr->GetSrc1()->IsInt32()");
      if (!bVar5) goto LAB_0055fe23;
      *puVar7 = 0;
    }
    pOVar9 = instr->m_src2;
    if (pOVar9 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3581,"(instr->GetSrc2())","instr->GetSrc2()");
      if (!bVar5) goto LAB_0055fe23;
      *puVar7 = 0;
      pOVar9 = instr->m_src2;
    }
    bVar5 = IR::Opnd::IsIntConstOpnd(pOVar9);
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3582,"(!instr->GetSrc2()->IsIntConstOpnd())",
                         "!instr->GetSrc2()->IsIntConstOpnd()");
      if (!bVar5) goto LAB_0055fe23;
      *puVar7 = 0;
    }
    if (instr->m_dst != (Opnd *)0x0) {
      pIVar8 = IR::Opnd::AsIntConstOpnd(instr->m_dst);
      iVar6 = IR::IntConstOpnd::AsInt32(pIVar8);
      if (1 < iVar6 + 1U) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x3586,"(c == 0 || c == -1)","c == 0 || c == -1");
        if (!bVar5) goto LAB_0055fe23;
        *puVar7 = 0;
      }
    }
  }
  bailOutKindToLower = IR::Instr::GetBailOutKind(instr);
  if (((1 < bailOutKindToLower - BailOutOnFailedHoistedBoundCheck) &&
      (bailOutKindToLower != BailOutOnArrayAccessHelperCall)) &&
     (bailOutKindToLower != BailOutOnInvalidatedArrayHeadSegment)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3590,
                       "(bailOutKind == IR::BailOutOnArrayAccessHelperCall || bailOutKind == IR::BailOutOnInvalidatedArrayHeadSegment || bailOutKind == IR::BailOutOnFailedHoistedBoundCheck || bailOutKind == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck)"
                       ,
                       "bailOutKind == IR::BailOutOnArrayAccessHelperCall || bailOutKind == IR::BailOutOnInvalidatedArrayHeadSegment || bailOutKind == IR::BailOutOnFailedHoistedBoundCheck || bailOutKind == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck"
                      );
    if (!bVar5) goto LAB_0055fe23;
    *puVar7 = 0;
  }
  target = IR::Instr::GetOrCreateContinueLabel(instr,false);
  LowerOneBailOutKind(this,instr,bailOutKindToLower,false,false);
  if ((instr->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3594,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar5) goto LAB_0055fe23;
    *puVar7 = 0;
  }
  local_40 = (LabelInstr *)instr->m_next;
  pOVar9 = IR::Instr::UnlinkSrc1(instr);
  LowerBoundCheck::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)pOVar9,(Opnd *)0x0,isRightOpnd);
  pLVar10 = (Lowerer *)IR::Instr::UnlinkSrc2(instr);
  LowerBoundCheck::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)pLVar10,(Opnd *)&DAT_00000001,isRightOpnd_00);
  autoReuseAddResultOpnd._16_8_ = pOVar9;
  bVar5 = IR::Opnd::IsIntConstOpnd(pOVar9);
  if ((bVar5) &&
     ((pLVar10 == (Lowerer *)0x0 || (bVar5 = IR::Opnd::IsIntConstOpnd((Opnd *)pLVar10), bVar5)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x35ad,
                       "(!leftOpnd->IsIntConstOpnd() || rightOpnd && !rightOpnd->IsIntConstOpnd())",
                       "!leftOpnd->IsIntConstOpnd() || rightOpnd && !rightOpnd->IsIntConstOpnd()");
    if (!bVar5) goto LAB_0055fe23;
    *puVar7 = 0;
  }
  bVar5 = true;
  if (instr->m_dst == (Opnd *)0x0) {
LAB_0055fbcf:
    local_50 = (IntConstOpnd *)0x0;
  }
  else {
    pOVar9 = IR::Instr::UnlinkDst(instr);
    local_50 = IR::Opnd::AsIntConstOpnd(pOVar9);
    if (local_50 == (IntConstOpnd *)0x0) goto LAB_0055fbcf;
    if ((local_50->super_EncodableOpnd<long>).m_value == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x35af,"(!offsetOpnd || offsetOpnd->GetValue() != 0)",
                         "!offsetOpnd || offsetOpnd->GetValue() != 0");
      if (!bVar5) goto LAB_0055fe23;
      *puVar7 = 0;
    }
    bVar5 = false;
  }
  OVar1 = instr->m_opcode;
  IR::Instr::Remove(instr);
  if (bVar5) {
    left = (undefined1  [8])0x0;
  }
  else {
    left = (undefined1  [8])(local_50->super_EncodableOpnd<long>).m_value;
  }
  func = (local_40->super_Instr).m_func;
  bVar5 = IR::Opnd::IsIntConstOpnd((Opnd *)autoReuseAddResultOpnd._16_8_);
  bVar4 = 1;
  if ((bVar5) &&
     (bVar5 = IR::Opnd::IsRegOpnd((Opnd *)pLVar10),
     left != (undefined1  [8])0xffffffff80000000 && bVar5)) {
    left = (undefined1  [8])-(long)left;
    local_32 = BrGe_A;
    bVar3 = 1;
    bVar4 = 0;
    this_00 = (Lowerer *)autoReuseAddResultOpnd._16_8_;
    autoReuseAddResultOpnd._16_8_ = pLVar10;
  }
  else {
    local_32 = BrLe_A;
    bVar3 = 0;
    this_00 = pLVar10;
  }
  pLVar10 = this_00;
  bVar5 = IR::Opnd::IsIntConstOpnd((Opnd *)this_00);
  if (bVar5) {
    pIVar8 = IR::Opnd::AsIntConstOpnd((Opnd *)this_00);
    pLVar10 = (Lowerer *)left;
    bVar5 = IntConstMath::Add((IntConstType)left,(pIVar8->super_EncodableOpnd<long>).m_value,TyInt32
                              ,(IntConstType *)local_70);
    if (!bVar5) {
      local_50 = (IntConstOpnd *)0x0;
      this_00 = (Lowerer *)0x0;
      left = local_70;
    }
  }
  local_70 = (undefined1  [8])0x0;
  autoReuseAddResultOpnd.func._1_1_ = 1;
  if ((bool)(bVar4 & left == (undefined1  [8])0xffffffffffffffff)) {
    local_32 = BrLt_A;
  }
  else {
    if (!(bool)(bVar3 & left == (undefined1  [8])&DAT_00000001)) {
      if (this_00 != (Lowerer *)0x0 && left != (undefined1  [8])0x0) {
        local_40 = IR::Instr::GetOrCreateContinueLabel((local_40->super_Instr).m_prev,true);
        if ((local_50 != (IntConstOpnd *)0x0) &&
           ((undefined1  [8])(local_50->super_EncodableOpnd<long>).m_value != left)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x35e3,"(!offsetOpnd || offsetOpnd->GetValue() == offset)",
                             "!offsetOpnd || offsetOpnd->GetValue() == offset");
          if (!bVar5) {
LAB_0055fe23:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar7 = 0;
        }
        opnd = (Lowerer *)IR::RegOpnd::New(TyInt32,func);
        IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_70,(Opnd *)opnd,func,true);
        if (local_50 == (IntConstOpnd *)0x0) {
          pIVar8 = IR::IntConstOpnd::New((IntConstType)left,TyInt32,func,false);
        }
        else {
          pIVar8 = (IntConstOpnd *)IR::Opnd::UseWithNewType(&local_50->super_Opnd,TyInt32,func);
        }
        InsertAdd(true,(Opnd *)opnd,(Opnd *)this_00,&pIVar8->super_Opnd,&local_40->super_Instr);
        pLVar10 = (Lowerer *)0x42b;
        InsertBranch(JO,local_40,&local_40->super_Instr);
        this_00 = opnd;
      }
      goto LAB_0055fcb5;
    }
    local_32 = BrGt_A;
  }
  left = (undefined1  [8])0x0;
LAB_0055fcb5:
  if (this_00 == (Lowerer *)0x0) {
    this_00 = (Lowerer *)IR::IntConstOpnd::New((IntConstType)left,TyInt32,func,false);
    pLVar10 = (Lowerer *)left;
  }
  InsertCompareBranch(pLVar10,(Opnd *)autoReuseAddResultOpnd._16_8_,(Opnd *)this_00,local_32,
                      OVar1 == UnsignedBoundCheck,target,&local_40->super_Instr,false);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_70);
  return;
}

Assistant:

void Lowerer::LowerBoundCheck(IR::Instr *const instr)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::BoundCheck || instr->m_opcode == Js::OpCode::UnsignedBoundCheck);

#if DBG
    if(instr->m_opcode == Js::OpCode::UnsignedBoundCheck)
    {
        // UnsignedBoundCheck is currently only supported for the pattern:
        //     UnsignedBoundCheck s1 <= s2 + c, where c == 0 || c == -1
        Assert(instr->GetSrc1()->IsRegOpnd());
        Assert(instr->GetSrc1()->IsInt32());
        Assert(instr->GetSrc2());
        Assert(!instr->GetSrc2()->IsIntConstOpnd());
        if(instr->GetDst())
        {
            const int32 c = instr->GetDst()->AsIntConstOpnd()->AsInt32();
            Assert(c == 0 || c == -1);
        }
    }
#endif

    const IR::BailOutKind bailOutKind = instr->GetBailOutKind();
    Assert(
        bailOutKind == IR::BailOutOnArrayAccessHelperCall ||
        bailOutKind == IR::BailOutOnInvalidatedArrayHeadSegment ||
        bailOutKind == IR::BailOutOnFailedHoistedBoundCheck ||
        bailOutKind == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck);

    IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(false);
    LowerOneBailOutKind(instr, bailOutKind, false);
    Assert(!instr->HasBailOutInfo());
    IR::Instr *insertBeforeInstr = instr->m_next;

#if DBG
    const auto VerifyLeftOrRightOpnd = [&](IR::Opnd *const opnd, const bool isRightOpnd)
    {
        if(!opnd)
        {
            Assert(isRightOpnd);
            return;
        }
        if(opnd->IsIntConstOpnd())
        {
            Assert(!isRightOpnd || opnd->AsIntConstOpnd()->GetValue() != 0);
            return;
        }
        Assert(opnd->GetType() == TyInt32 || opnd->GetType() == TyUint32);
    };
#endif

    // left <= right + offset (src1 <= src2 + dst)
    IR::Opnd *leftOpnd = instr->UnlinkSrc1();
    DebugOnly(VerifyLeftOrRightOpnd(leftOpnd, false));
    IR::Opnd *rightOpnd = instr->UnlinkSrc2();
    DebugOnly(VerifyLeftOrRightOpnd(rightOpnd, true));
    Assert(!leftOpnd->IsIntConstOpnd() || rightOpnd && !rightOpnd->IsIntConstOpnd());
    IR::IntConstOpnd *offsetOpnd = instr->GetDst() ? instr->UnlinkDst()->AsIntConstOpnd() : nullptr;
    Assert(!offsetOpnd || offsetOpnd->GetValue() != 0);
    const bool doUnsignedCompare = instr->m_opcode == Js::OpCode::UnsignedBoundCheck;
    instr->Remove();

    Func *const func = insertBeforeInstr->m_func;

    IntConstType offset = offsetOpnd ? offsetOpnd->GetValue() : 0;
    Js::OpCode compareOpCode = Js::OpCode::BrLe_A;
    if(leftOpnd->IsIntConstOpnd() && rightOpnd->IsRegOpnd() && offset != IntConstMin)
    {
        // Put the constants together: swap the operands, negate the offset, and invert the branch
        IR::Opnd *const tempOpnd = leftOpnd;
        leftOpnd = rightOpnd;
        rightOpnd = tempOpnd;
        offset = -offset;
        compareOpCode = Js::OpCode::BrGe_A;
    }

    if(rightOpnd->IsIntConstOpnd())
    {
        // Try to aggregate right + offset into a constant offset
        IntConstType newOffset;
        if(!IntConstMath::Add(offset, rightOpnd->AsIntConstOpnd()->GetValue(), TyInt32, &newOffset))
        {
            offset = newOffset;
            rightOpnd = nullptr;
            offsetOpnd = nullptr;
        }
    }

    // Determine if the Add for (right + offset) is necessary, and the op code that will be used for the comparison
    IR::AutoReuseOpnd autoReuseAddResultOpnd;
    if(offset == -1 && compareOpCode == Js::OpCode::BrLe_A)
    {
        offset = 0;
        compareOpCode = Js::OpCode::BrLt_A;
    }
    else if(offset == 1 && compareOpCode == Js::OpCode::BrGe_A)
    {
        offset = 0;
        compareOpCode = Js::OpCode::BrGt_A;
    }
    else if(offset != 0 && rightOpnd)
    {
        // Need to Add (right + offset). If it overflows, bail out.
        IR::LabelInstr *const bailOutLabel = insertBeforeInstr->m_prev->GetOrCreateContinueLabel(true);
        insertBeforeInstr = bailOutLabel;

        //     mov  temp, right
        //     add  temp, offset
        //     jo   $bailOut
        // $bailOut: (insertBeforeInstr)
        Assert(!offsetOpnd || offsetOpnd->GetValue() == offset);
        IR::RegOpnd *const addResultOpnd = IR::RegOpnd::New(TyInt32, func);
        autoReuseAddResultOpnd.Initialize(addResultOpnd, func);
        InsertAdd(
            true,
            addResultOpnd,
            rightOpnd,
            offsetOpnd ? offsetOpnd->UseWithNewType(TyInt32, func) : IR::IntConstOpnd::New(offset, TyInt32, func),
            insertBeforeInstr);
        InsertBranch(LowererMD::MDOverflowBranchOpcode, bailOutLabel, insertBeforeInstr);

        rightOpnd = addResultOpnd;
    }

    //     cmp  left, right
    //     jl[e] $skipBailOut
    // $bailOut:
    if(!rightOpnd)
    {
        rightOpnd = IR::IntConstOpnd::New(offset, TyInt32, func);
    }
    InsertCompareBranch(leftOpnd, rightOpnd, compareOpCode, doUnsignedCompare, skipBailOutLabel, insertBeforeInstr);
}